

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autocompact_test.cc
# Opt level: O2

string * __thiscall
leveldb::AutoCompactTest::Key_abi_cxx11_(string *__return_storage_ptr__,AutoCompactTest *this,int i)

{
  allocator local_79;
  char buf [100];
  
  snprintf(buf,100,"key%06d",i);
  std::__cxx11::string::string((string *)__return_storage_ptr__,buf,&local_79);
  return __return_storage_ptr__;
}

Assistant:

std::string Key(int i) {
    char buf[100];
    std::snprintf(buf, sizeof(buf), "key%06d", i);
    return std::string(buf);
  }